

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O3

void __thiscall soul::ModuleCloner::populateClonedStruct(ModuleCloner *this,Structure *old)

{
  Structure *pSVar1;
  size_t sVar2;
  Structure *pSVar3;
  Structure *oldObject;
  mapped_type *pmVar4;
  long lVar5;
  Member *t;
  undefined8 local_38;
  BoundedIntSize local_30;
  BoundedIntSize BStack_2c;
  StructurePtr local_28;
  
  local_38 = old;
  pmVar4 = std::__detail::
           _Map_base<const_soul::Structure_*,_std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>,_std::__detail::_Select1st,_std::equal_to<const_soul::Structure_*>,_std::hash<const_soul::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_soul::Structure_*,_std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>,_std::__detail::_Select1st,_std::equal_to<const_soul::Structure_*>,_std::hash<const_soul::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->structMappings,(key_type *)&local_38);
  pSVar1 = pmVar4->object;
  if (pSVar1 != (Structure *)0x0) {
    sVar2 = (pSVar1->members).numActive;
    if (sVar2 != 0) {
      t = (pSVar1->members).items;
      lVar5 = sVar2 << 6;
      do {
        cloneType((Type *)&local_38,this->structMappings,&t->type);
        pSVar3 = local_38;
        (t->type).category = (Category)local_38;
        (t->type).arrayElementCategory = local_38._1_1_;
        (t->type).isRef = local_38._2_1_;
        (t->type).isConstant = local_38._3_1_;
        local_38._4_4_ = SUB84(pSVar3,4);
        (t->type).primitiveType.type = local_38._4_4_;
        (t->type).boundingSize = local_30;
        (t->type).arrayElementBoundingSize = BStack_2c;
        pSVar1 = (t->type).structure.object;
        local_38 = pSVar3;
        if (local_28.object != pSVar1) {
          (t->type).structure.object = local_28.object;
          local_28.object = (Structure *)0x0;
          RefCountedPtr<soul::Structure>::decIfNotNull(pSVar1);
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(local_28.object);
        t = t + 1;
        lVar5 = lVar5 + -0x40;
      } while (lVar5 != 0);
    }
    return;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x47);
}

Assistant:

void populateClonedStruct (const Structure& old)
    {
        for (auto& m : structMappings[std::addressof (old)]->getMembers())
            m.type = cloneType (m.type);
    }